

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O3

int bam_plp_push(bam_plp_t iter,bam1_t *b)

{
  uint *puVar1;
  uint *puVar2;
  undefined1 *puVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  byte bVar6;
  kh_olap_hash_t *h;
  lbnode_t *plVar7;
  uint8_t *__s2;
  khint32_t *pkVar8;
  lbnode_t *plVar9;
  olap_hash_t *poVar10;
  uint64_t uVar11;
  mempool_t *pmVar12;
  ulong uVar13;
  uint8_t uVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  __linkbuf_t *p_Var18;
  bam_pileup1_t *pbVar19;
  byte bVar20;
  sbyte sVar21;
  uint uVar22;
  uint8_t *puVar23;
  int *_n_plp;
  undefined1 uVar24;
  int iVar25;
  int *_pos;
  khint_t new_n_buckets;
  uint *_tid;
  int iVar26;
  bam_plp_t iter_00;
  undefined1 *puVar27;
  ulong uVar28;
  int iVar29;
  int iVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  int iVar34;
  uint uVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  long lVar39;
  int iVar40;
  bool bVar41;
  int local_a4;
  uint local_a0;
  uint *local_98;
  
  if (iter->error != 0) {
    return -1;
  }
  if (b == (bam1_t *)0x0) {
    iter->is_eof = 1;
    return 0;
  }
  iVar36 = (b->core).tid;
  if (((iVar36 < 0) || (((b->core).field_0xc & 4) != 0)) ||
     ((iter->tid == iVar36 && ((iter->pos == (b->core).pos && (iter->maxcnt < iter->mp->cnt)))))) {
    overlap_remove((bam_plp_t)iter->overlaps,b);
    return 0;
  }
  bam_copy1(&iter->tail->b,b);
  h = iter->overlaps;
  if (h == (kh_olap_hash_t *)0x0) goto LAB_0011821e;
  plVar7 = iter->tail;
  _n_plp = *(int **)&(plVar7->b).core.field_0x8;
  if (((ulong)_n_plp & 0xa00000000) != 0x200000000) goto LAB_0011821e;
  iVar36 = (plVar7->b).core.l_qseq;
  iVar34 = (plVar7->b).core.isize;
  iVar16 = -iVar34;
  if (0 < iVar34) {
    iVar16 = iVar34;
  }
  if (iVar36 * 2 <= iVar16) goto LAB_0011821e;
  __s2 = (plVar7->b).data;
  uVar22 = h->n_buckets;
  uVar17 = (ulong)uVar22;
  if (uVar22 == 0) {
    uVar28 = 0;
LAB_00117de6:
    uVar33 = (uint)uVar28;
    if (uVar33 != uVar22) {
      plVar9 = h->vals[uVar28];
      local_a0 = (plVar7->b).core.pos;
      iVar34 = (plVar9->b).core.pos;
      iVar16 = local_a0 - iVar34;
      if ((-1 < iVar16) && (uVar17 = *(ulong *)&(plVar9->b).core.field_0x8, 0xffffffffffff < uVar17)
         ) {
        _tid = (uint *)((plVar9->b).data + (uVar17 >> 0x18 & 0xff));
        puVar1 = _tid + (uVar17 >> 0x30);
        local_98 = (uint *)(__s2 + ((ulong)_n_plp >> 0x18 & 0xff));
        puVar2 = local_98 + ((ulong)_n_plp >> 0x30);
        iVar26 = (plVar9->b).core.l_qseq + 1 >> 1;
        iVar36 = iVar36 + 1 >> 1;
        iVar40 = 0;
        iVar29 = 0;
        do {
          uVar22 = *_tid;
          uVar31 = uVar22 & 0xf;
          iter_00 = (bam_plp_t)(ulong)uVar31;
          uVar35 = uVar22 >> 4;
          if (uVar31 == 4) {
LAB_00117ee2:
            iVar40 = iVar40 + uVar35;
          }
          else if (1 < uVar31 - 5) {
            if ((uVar22 & 7) == 0 || uVar31 == 7) {
              if ((int)(iVar16 - uVar35) < 0) {
                if ((int *)0xffffffffffff < _n_plp) {
                  iVar40 = iVar40 + iVar16;
                  iVar29 = iVar29 + iVar16;
                  _n_plp = (int *)0x0;
                  iVar30 = 0;
                  local_a4 = 0;
                  iVar25 = 0;
                  goto LAB_0011835a;
                }
                break;
              }
              iVar40 = iVar40 + uVar35;
              iVar29 = iVar29 + uVar35;
              iVar16 = iVar16 - uVar35;
            }
            else {
              if (uVar31 == 1) goto LAB_00117ee2;
              if ((uVar22 & 0xe) != 2) {
                bam_plp_push_cold_1();
                goto LAB_001186ee;
              }
              iVar16 = iVar16 - uVar35;
              if (iVar16 < 1) {
                iVar16 = 0;
              }
              iVar29 = iVar29 + uVar35;
            }
          }
          _tid = _tid + 1;
        } while (_tid < puVar1);
      }
      goto LAB_00117f42;
    }
  }
  else {
    uVar33 = (uint)(char)*__s2;
    if (*__s2 == '\0') {
      uVar33 = 0;
    }
    else {
      uVar14 = __s2[1];
      if (uVar14 != '\0') {
        puVar23 = __s2 + 2;
        do {
          uVar33 = (int)(char)uVar14 + uVar33 * 0x1f;
          uVar14 = *puVar23;
          puVar23 = puVar23 + 1;
        } while (uVar14 != '\0');
      }
    }
    uVar33 = uVar33 & uVar22 - 1;
    pkVar8 = h->flags;
    iVar34 = 1;
    uVar31 = uVar33;
    do {
      uVar35 = pkVar8[uVar31 >> 4];
      bVar20 = (char)uVar31 * '\x02' & 0x1e;
      uVar15 = uVar35 >> bVar20;
      if (((uVar15 & 2) != 0) ||
         (((uVar15 & 1) == 0 && (iVar16 = strcmp(h->keys[uVar31],(char *)__s2), iVar16 == 0)))) {
        uVar28 = (ulong)uVar31;
        if ((uVar35 >> bVar20 & 3) != 0) {
          uVar28 = uVar17;
        }
        goto LAB_00117de6;
      }
      uVar31 = uVar31 + iVar34 & uVar22 - 1;
      iVar34 = iVar34 + 1;
    } while (uVar31 != uVar33);
  }
  if (h->n_occupied < h->upper_bound) {
LAB_00118050:
    uVar22 = (uint)uVar17;
    uVar33 = (uint)(char)*__s2;
    if (*__s2 == '\0') {
      uVar33 = 0;
    }
    else {
      uVar14 = __s2[1];
      if (uVar14 != '\0') {
        puVar23 = __s2 + 2;
        do {
          uVar33 = (int)(char)uVar14 + uVar33 * 0x1f;
          uVar14 = *puVar23;
          puVar23 = puVar23 + 1;
        } while (uVar14 != '\0');
      }
    }
    uVar33 = uVar33 & uVar22 - 1;
    pkVar8 = h->flags;
    if ((pkVar8[uVar33 >> 4] >> ((char)uVar33 * '\x02' & 0x1fU) & 2) == 0) {
      iVar36 = 1;
      uVar31 = uVar33;
      do {
        uVar35 = pkVar8[uVar31 >> 4];
        uVar32 = uVar31 * 2 & 0x1e;
        sVar21 = (sbyte)uVar32;
        uVar15 = uVar35 >> sVar21;
        if (((uVar15 & 2) != 0) ||
           (((uVar15 & 1) == 0 && (iVar34 = strcmp(h->keys[uVar31],(char *)__s2), iVar34 == 0)))) {
          bVar41 = (uVar35 >> sVar21 & 2) == 0;
          uVar33 = (uint)uVar17;
          goto LAB_00118192;
        }
        if ((uVar35 >> uVar32 & 1) != 0) {
          uVar17 = (ulong)uVar31;
        }
        uVar31 = uVar31 + iVar36 & uVar22 - 1;
        iVar36 = iVar36 + 1;
      } while (uVar31 != uVar33);
      bVar41 = true;
      uVar31 = uVar33;
      uVar33 = uVar22;
      if ((uint)uVar17 == uVar22) {
LAB_00118192:
        if (uVar33 == uVar22) {
          uVar33 = uVar31;
        }
        if (bVar41) {
          uVar33 = uVar31;
        }
        uVar17 = (ulong)uVar33;
      }
    }
    else {
      uVar17 = (ulong)uVar33;
    }
    uVar13 = uVar17 >> 4;
    bVar20 = (char)uVar17 * '\x02' & 0x1e;
    uVar28 = uVar17;
    if ((pkVar8[uVar13] >> bVar20 & 2) == 0) {
      if ((pkVar8[uVar13] >> bVar20 & 1) != 0) {
        h->keys[uVar17] = (kh_cstr_t)__s2;
        h->flags[uVar13] = h->flags[uVar13] & ~(3 << bVar20);
        h->size = h->size + 1;
      }
    }
    else {
      h->keys[uVar17] = (kh_cstr_t)__s2;
      h->flags[uVar13] = h->flags[uVar13] & ~(3 << bVar20);
      uVar4 = h->size;
      uVar5 = h->n_occupied;
      h->size = uVar4 + 1;
      h->n_occupied = uVar5 + 1;
    }
  }
  else {
    if (h->size * 2 < uVar22) {
      new_n_buckets = uVar22 - 1;
    }
    else {
      new_n_buckets = uVar22 + 1;
    }
    iVar36 = kh_resize_olap_hash(h,new_n_buckets);
    uVar17 = (ulong)h->n_buckets;
    uVar28 = (ulong)h->n_buckets;
    if (-1 < iVar36) goto LAB_00118050;
  }
  iter->overlaps->vals[uVar28] = plVar7;
LAB_0011821e:
  plVar7 = iter->tail;
  uVar11 = iter->id;
  iter->id = uVar11 + 1;
  (plVar7->b).id = uVar11;
  iVar36 = (b->core).pos;
  plVar7->beg = iVar36;
  uVar17 = *(ulong *)&(b->core).field_0x8;
  iVar34 = 0;
  if (0xffffffffffff < uVar17) {
    uVar28 = 0;
    iVar34 = 0;
    do {
      iVar34 = iVar34 + (*(uint *)(b->data + uVar28 * 4 + (uVar17 >> 0x18 & 0xff)) >> 4 &
                        (int)((0x3c1a7U >>
                              ((char)*(uint *)(b->data + uVar28 * 4 + (uVar17 >> 0x18 & 0xff)) *
                               '\x02' & 0x1fU)) << 0x1e) >> 0x1f);
      uVar28 = uVar28 + 1;
    } while (uVar17 >> 0x30 != uVar28);
  }
  plVar7->end = iVar34 + iVar36;
  plVar7->s = g_cstate_null;
  plVar7 = iter->tail;
  iVar36 = plVar7->end;
  (plVar7->s).end = iVar36 + -1;
  iVar34 = (b->core).tid;
  if (iVar34 < iter->max_tid) {
    bam_plp_push_cold_6();
    return -1;
  }
  iVar16 = plVar7->beg;
  if ((iVar34 == iter->max_tid) && (iVar16 < iter->max_pos)) {
    bam_plp_push_cold_5();
    return -1;
  }
  iter->max_tid = iVar34;
  iter->max_pos = iVar16;
  if ((iVar36 <= iter->pos) && ((plVar7->b).core.tid <= iter->tid)) {
    return 0;
  }
  pmVar12 = iter->mp;
  pmVar12->cnt = pmVar12->cnt + 1;
  iVar36 = pmVar12->n;
  if ((long)iVar36 == 0) {
    p_Var18 = (__linkbuf_t *)calloc(1,0x58);
  }
  else {
    pmVar12->n = iVar36 + -1;
    p_Var18 = pmVar12->buf[(long)iVar36 + -1];
  }
  plVar7->next = p_Var18;
  iter->tail = p_Var18;
  return 0;
  while (local_98 = local_98 + 1, local_98 < puVar2) {
LAB_0011835a:
    uVar22 = *local_98;
    uVar31 = uVar22 & 0xf;
    iter_00 = (bam_plp_t)(ulong)uVar31;
    uVar35 = uVar22 >> 4;
    if (uVar31 == 4) {
LAB_00118372:
      iVar30 = iVar30 + uVar35;
    }
    else if (1 < uVar31 - 5) {
      if ((uVar22 & 7) == 0 || uVar31 == 7) {
        if ((int)(iVar25 - uVar35) < 0) {
          iVar30 = iVar30 + iVar25;
          local_a4 = local_a4 + iVar25;
          goto LAB_00118408;
        }
        iVar30 = iVar30 + uVar35;
        local_a4 = local_a4 + uVar35;
        iVar25 = iVar25 - uVar35;
      }
      else {
        if (uVar31 == 1) goto LAB_00118372;
        if ((uVar22 & 0xe) != 2) goto LAB_001186ee;
        iVar25 = iVar25 - uVar35;
        if (iVar25 < 1) {
          iVar25 = 0;
        }
        local_a4 = local_a4 + uVar35;
      }
    }
  }
LAB_00117f42:
  poVar10 = iter->overlaps;
  if (poVar10->n_buckets != uVar33) {
    uVar22 = poVar10->flags[uVar28 >> 4];
    uVar33 = uVar33 * 2 & 0x1e;
    if ((uVar22 >> (sbyte)uVar33 & 3) == 0) {
      poVar10->flags[uVar28 >> 4] = uVar22 | 1 << uVar33;
      poVar10->size = poVar10->size - 1;
    }
  }
  if (plVar9->end + -1 != (plVar9->s).end) {
    __assert_fail("a->end-1 == a->s.end",
                  "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/sam.c"
                  ,0x66e,"void overlap_push(bam_plp_t, lbnode_t *)");
  }
  iVar36 = (plVar9->b).core.pos;
  uVar17 = *(ulong *)&(plVar9->b).core.field_0x8;
  iVar34 = 0;
  if (0xffffffffffff < uVar17) {
    uVar28 = 0;
    iVar34 = 0;
    do {
      uVar22 = *(uint *)((plVar9->b).data + uVar28 * 4 + (uVar17 >> 0x18 & 0xff));
      iVar34 = iVar34 + (uVar22 >> 4 &
                        (int)((0x3c1a7U >> ((char)uVar22 * '\x02' & 0x1fU)) << 0x1e) >> 0x1f);
      uVar28 = uVar28 + 1;
    } while (uVar17 >> 0x30 != uVar28);
  }
  plVar9->end = iVar34 + iVar36;
  (plVar9->s).end = iVar34 + iVar36 + -1;
  goto LAB_0011821e;
LAB_00118408:
  do {
    if (-1 < iVar29) {
      _n_plp = (int *)(ulong)(local_a0 - iVar34);
LAB_0011841c:
      if (iVar29 < (int)(local_a0 - iVar34)) {
        iVar37 = iVar29;
        if (_tid < puVar1) {
          do {
            uVar22 = *_tid;
            uVar31 = uVar22 & 0xf;
            iter_00 = (bam_plp_t)(ulong)uVar31;
            uVar35 = uVar22 >> 4;
            if ((uVar22 & 7) == 0 || uVar31 == 7) {
              if (iVar16 < (int)(uVar35 - 1)) goto LAB_001184a5;
            }
            else if ((uVar22 & 0xe) == 2) {
              iVar37 = iVar37 + uVar35;
            }
            else if ((uVar31 == 4) || (uVar31 == 1)) {
              iVar40 = iVar40 + uVar35;
            }
            else if (1 < uVar31 - 5) goto LAB_001186f3;
            _tid = _tid + 1;
            iVar16 = 0;
            if (puVar1 <= _tid) break;
          } while( true );
        }
        goto LAB_00117f42;
      }
    }
LAB_001184c1:
    uVar22 = iVar34 + iVar29;
    _n_plp = (int *)(ulong)uVar22;
    if ((int)local_a0 <= (int)uVar22) {
      local_a0 = uVar22;
    }
    iVar37 = (plVar7->b).core.pos;
    if (-1 < local_a4) {
LAB_00118500:
      iVar38 = local_a4;
      if (local_a4 < (int)(local_a0 - iVar37)) {
        do {
          if (puVar2 <= local_98) goto LAB_00117f42;
          uVar31 = *local_98;
          uVar35 = uVar31 & 0xf;
          iter_00 = (bam_plp_t)(ulong)uVar35;
          uVar15 = uVar31 >> 4;
          if ((uVar31 & 7) == 0 || uVar35 == 7) {
            if (iVar25 < (int)(uVar15 - 1)) goto LAB_001185af;
          }
          else if ((uVar31 & 0xe) == 2) {
            iVar38 = iVar38 + uVar15;
          }
          else if ((uVar35 == 4) || (uVar35 == 1)) {
            iVar30 = iVar30 + uVar15;
          }
          else if (1 < uVar35 - 5) goto LAB_001186f8;
          local_98 = local_98 + 1;
          iVar25 = 0;
        } while( true );
      }
    }
LAB_001185db:
    uVar31 = iVar37 + local_a4;
    if ((int)local_a0 <= (int)uVar31) {
      local_a0 = uVar31;
    }
    local_a0 = local_a0 + 1;
  } while (uVar22 != uVar31);
  puVar3 = (undefined1 *)((long)puVar1 + (long)iVar40 + (long)iVar26);
  bVar20 = *(byte *)((long)puVar1 + (long)iVar40 + (long)iVar26);
  lVar39 = (long)iVar30;
  if (((*(byte *)((long)puVar2 + (long)(iVar30 >> 1)) >> (~((char)iVar30 * '\x04') & 4U) ^
       *(byte *)((long)puVar1 + (long)(iVar40 >> 1)) >> (~((char)iVar40 * '\x04') & 4U)) & 0xf) == 0
     ) {
    uVar22 = (uint)*(byte *)((long)puVar2 + lVar39 + iVar36) + (uint)bVar20;
    if (199 < uVar22) {
      uVar22 = 200;
    }
    uVar24 = (undefined1)uVar22;
LAB_001186b8:
    puVar27 = (undefined1 *)((long)puVar2 + lVar39 + iVar36);
    *puVar3 = uVar24;
  }
  else {
    bVar6 = *(byte *)((long)puVar2 + lVar39 + iVar36);
    if (bVar6 <= bVar20) {
      uVar24 = (undefined1)(int)((double)bVar20 * 0.8);
      goto LAB_001186b8;
    }
    *(char *)((long)puVar2 + lVar39 + iVar36) = (char)(int)((double)bVar6 * 0.8);
    puVar27 = puVar3;
  }
  *puVar27 = 0;
  iVar34 = (plVar9->b).core.pos;
  goto LAB_00118408;
LAB_001184a5:
  iVar40 = iVar40 + 1;
  iVar16 = iVar16 + 1;
  iVar29 = iVar37 + 1;
  if (iVar37 < -1) goto LAB_001184c1;
  goto LAB_0011841c;
LAB_001185af:
  iVar30 = iVar30 + 1;
  iVar25 = iVar25 + 1;
  local_a4 = iVar38 + 1;
  if (iVar38 < -1) goto LAB_001185db;
  goto LAB_00118500;
LAB_001186ee:
  bam_plp_push_cold_2();
LAB_001186f3:
  bam_plp_push_cold_3();
LAB_001186f8:
  bam_plp_push_cold_4();
  if ((iter_00->func == (bam_plp_auto_f)0x0) || (iter_00->error != 0)) {
LAB_00118718:
    *_n_plp = -1;
  }
  else {
    pbVar19 = bam_plp_next(iter_00,(int *)_tid,_pos,_n_plp);
    if (pbVar19 != (bam_pileup1_t *)0x0) goto LAB_00118720;
    *_n_plp = 0;
    if (iter_00->is_eof == 0) {
      do {
        iVar36 = (*iter_00->func)(iter_00->data,iter_00->b);
        if (iVar36 < 0) {
          if (iVar36 == -1) {
            if (iter_00->error == 0) {
              iter_00->is_eof = 1;
            }
            pbVar19 = bam_plp_next(iter_00,(int *)_tid,_pos,_n_plp);
            return (int)pbVar19;
          }
          iter_00->error = iVar36;
          goto LAB_00118718;
        }
        iVar36 = bam_plp_push(iter_00,iter_00->b);
        if (iVar36 < 0) goto LAB_00118718;
        pbVar19 = bam_plp_next(iter_00,(int *)_tid,_pos,_n_plp);
      } while (pbVar19 == (bam_pileup1_t *)0x0);
      goto LAB_00118720;
    }
  }
  pbVar19 = (bam_pileup1_t *)0x0;
LAB_00118720:
  return (int)pbVar19;
}

Assistant:

int bam_plp_push(bam_plp_t iter, const bam1_t *b)
{
    if (iter->error) return -1;
    if (b) {
        if (b->core.tid < 0) { overlap_remove(iter, b); return 0; }
        // Skip only unmapped reads here, any additional filtering must be done in iter->func
        if (b->core.flag & BAM_FUNMAP) { overlap_remove(iter, b); return 0; }
        if (iter->tid == b->core.tid && iter->pos == b->core.pos && iter->mp->cnt > iter->maxcnt)
        {
            overlap_remove(iter, b);
            return 0;
        }
        bam_copy1(&iter->tail->b, b);
        overlap_push(iter, iter->tail);
#ifndef BAM_NO_ID
        iter->tail->b.id = iter->id++;
#endif
        iter->tail->beg = b->core.pos;
        iter->tail->end = b->core.pos + bam_cigar2rlen(b->core.n_cigar, bam_get_cigar(b));
        iter->tail->s = g_cstate_null; iter->tail->s.end = iter->tail->end - 1; // initialize cstate_t
        if (b->core.tid < iter->max_tid) {
            fprintf(stderr, "[bam_pileup_core] the input is not sorted (chromosomes out of order)\n");
            iter->error = 1;
            return -1;
        }
        if ((b->core.tid == iter->max_tid) && (iter->tail->beg < iter->max_pos)) {
            fprintf(stderr, "[bam_pileup_core] the input is not sorted (reads out of order)\n");
            iter->error = 1;
            return -1;
        }
        iter->max_tid = b->core.tid; iter->max_pos = iter->tail->beg;
        if (iter->tail->end > iter->pos || iter->tail->b.core.tid > iter->tid) {
            iter->tail->next = mp_alloc(iter->mp);
            iter->tail = iter->tail->next;
        }
    } else iter->is_eof = 1;
    return 0;
}